

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::RandSequenceStatementSyntax::getChild(RandSequenceStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  undefined8 in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff58;
  TokenOrSyntax *in_stack_ffffffffffffff60;
  nullptr_t in_stack_ffffffffffffff68;
  Info *in_stack_ffffffffffffff70;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 2:
    token.info = in_stack_ffffffffffffff70;
    token._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token);
    break;
  case 3:
    token_00.info = in_stack_ffffffffffffff70;
    token_00._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_00);
    break;
  case 4:
    token_01.info = in_stack_ffffffffffffff70;
    token_01._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_01);
    break;
  case 5:
    token_02.info = in_stack_ffffffffffffff70;
    token_02._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_02);
    break;
  case 6:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x98),in_stack_ffffffffffffff58);
    break;
  case 7:
    token_03.info = in_stack_ffffffffffffff70;
    token_03._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_03);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax RandSequenceStatementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return randsequence;
        case 3: return openParen;
        case 4: return firstProduction;
        case 5: return closeParen;
        case 6: return &productions;
        case 7: return endsequence;
        default: return nullptr;
    }
}